

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMathCommand.cxx
# Opt level: O2

bool __thiscall
cmMathCommand::HandleExprCommand
          (cmMathCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  int iVar2;
  bool bVar3;
  cmExprParserHelper helper;
  char buffer [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_4c8;
  cmExprParserHelper local_4a8;
  string local_428 [32];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    cmExprParserHelper::cmExprParserHelper(&local_4a8);
    iVar2 = cmExprParserHelper::ParseString(&local_4a8,pbVar1[2]._M_dataplus._M_p,0);
    bVar3 = iVar2 != 0;
    if (iVar2 == 0) {
      std::operator+(&bStack_4c8,"cannot parse the expression: \"",pbVar1 + 2);
      std::operator+(local_428,&bStack_4c8,"\": ");
      std::__cxx11::string::~string((string *)&bStack_4c8);
      std::__cxx11::string::append((char *)local_428);
      cmCommand::SetError(&this->super_cmCommand,local_428);
      std::__cxx11::string::~string((string *)local_428);
    }
    else {
      sprintf((char *)local_428,"%d",(ulong)(uint)local_4a8.Result);
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar1 + 1,(char *)local_428);
    }
    cmExprParserHelper::~cmExprParserHelper(&local_4a8);
  }
  else {
    std::__cxx11::string::string
              ((string *)local_428,"EXPR called with incorrect arguments.",(allocator *)&local_4a8);
    cmCommand::SetError(&this->super_cmCommand,local_428);
    std::__cxx11::string::~string((string *)local_428);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmMathCommand::HandleExprCommand(std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    this->SetError("EXPR called with incorrect arguments.");
    return false;
  }

  const std::string& outputVariable = args[1];
  const std::string& expression = args[2];

  cmExprParserHelper helper;
  if (!helper.ParseString(expression.c_str(), 0)) {
    std::string e = "cannot parse the expression: \"" + expression + "\": ";
    e += helper.GetError();
    this->SetError(e);
    return false;
  }

  char buffer[1024];
  sprintf(buffer, "%d", helper.GetResult());

  this->Makefile->AddDefinition(outputVariable, buffer);
  return true;
}